

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.c
# Opt level: O1

float calc_max_generic(pooling_calc_context_t calc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  int in_stack_0000002c;
  undefined8 in_stack_00000030;
  code *in_stack_00000038;
  int in_stack_00000050;
  
  fVar6 = -3.4028235e+38;
  if (in_stack_0000002c == 3) {
    if (in_stack_00000008 < in_stack_0000000c) {
      iVar2 = in_stack_00000010 * in_stack_00000024 +
              in_stack_00000020 * in_stack_00000008 + in_stack_00000050 + in_stack_00000018;
      fVar6 = -3.4028235e+38;
      do {
        iVar5 = iVar2;
        iVar4 = in_stack_00000010;
        if (in_stack_00000010 < in_stack_00000014) {
          do {
            fVar7 = fVar6;
            iVar3 = in_stack_0000001c - in_stack_00000018;
            iVar1 = iVar5;
            if (in_stack_00000018 < in_stack_0000001c) {
              do {
                fVar6 = (float)(*in_stack_00000038)(in_stack_00000030,iVar1);
                if (fVar6 <= fVar7) {
                  fVar6 = fVar7;
                }
                iVar1 = iVar1 + 1;
                iVar3 = iVar3 + -1;
                fVar7 = fVar6;
              } while (iVar3 != 0);
            }
            iVar4 = iVar4 + 1;
            iVar5 = iVar5 + in_stack_00000024;
          } while (iVar4 != in_stack_00000014);
        }
        in_stack_00000008 = in_stack_00000008 + 1;
        iVar2 = iVar2 + in_stack_00000020;
      } while (in_stack_00000008 != in_stack_0000000c);
    }
  }
  else if ((in_stack_0000002c == 2) && (in_stack_00000008 < in_stack_0000000c)) {
    fVar6 = -3.4028235e+38;
    do {
      if (in_stack_00000010 < in_stack_00000014) {
        iVar2 = in_stack_00000020 * in_stack_00000008 + in_stack_00000010;
        fVar7 = fVar6;
        do {
          fVar6 = (float)(*in_stack_00000038)(in_stack_00000030,in_stack_00000050 + iVar2);
          if (fVar6 <= fVar7) {
            fVar6 = fVar7;
          }
          iVar2 = iVar2 + 1;
          fVar7 = fVar6;
        } while (iVar2 < in_stack_00000014 + in_stack_00000020 * in_stack_00000008);
      }
      in_stack_00000008 = in_stack_00000008 + 1;
    } while (in_stack_00000008 != in_stack_0000000c);
  }
  return fVar6;
}

Assistant:

float calc_max_generic(pooling_calc_context_t calc) {
  float max_val = -FLT_MAX;
  if (calc.kernel_size == 2) {
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = ix * calc.hstride + calc.wstart;
           jx < ix * calc.hstride + calc.wend; jx++) {
        float val = calc.get_x(calc.x, jx + calc.offset_x);
        if (max_val < val) {
          max_val = val;
        }
      }
    }
  } else if (calc.kernel_size == 3) {
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = calc.wstart; jx < calc.wend; jx++) {
        for (int kx = calc.dstart; kx < calc.dend; kx++) {
          float val = calc.get_x(calc.x, ix * calc.hstride + jx * calc.wstride +
                                             kx + calc.offset_x);
          if (max_val < val) {
            max_val = val;
          }
        }
      }
    }
  }
  return max_val;
}